

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

AuxArray<unsigned_int> * __thiscall
Js::FunctionBody::AllocateSlotIdInCachedScopeToNestedIndexArray(FunctionBody *this,uint32 slotCount)

{
  Recycler *alloc;
  AuxArray<unsigned_int> *ptr;
  undefined1 local_48 [8];
  TrackAllocData data;
  
  data.typeinfo = (type_info *)((ulong)slotCount << 2);
  local_48 = (undefined1  [8])&AuxArray<unsigned_int>::typeinfo;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_29f156b;
  data.filename._0_4_ = 0x19d2;
  alloc = Memory::Recycler::TrackAllocInfo
                    (((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
                     recycler,(TrackAllocData *)local_48);
  ptr = (AuxArray<unsigned_int> *)new<Memory::Recycler>(4,alloc,0x37fe86,0);
  ptr->count = slotCount;
  FunctionProxy::SetAuxPtr<(Js::FunctionProxy::AuxPointerType)23,Js::AuxArray<unsigned_int>*>
            ((FunctionProxy *)this,ptr);
  return ptr;
}

Assistant:

Js::AuxArray<uint32> * FunctionBody::AllocateSlotIdInCachedScopeToNestedIndexArray(uint32 slotCount)
    {
        Js::AuxArray<uint32> * slotIdToNestedIndexArray = RecyclerNewPlusLeaf(GetScriptContext()->GetRecycler(), slotCount * sizeof(uint32), Js::AuxArray<uint32>, slotCount);
        SetSlotIdInCachedScopeToNestedIndexArray(slotIdToNestedIndexArray);
        return slotIdToNestedIndexArray;
    }